

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

void rw::ps2::unswizzleRaster(Raster *raster)

{
  uint8 *puVar1;
  int iVar2;
  uint uVar3;
  uint32 uVar4;
  byte bVar5;
  uint32 logw;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint32 uVar14;
  uint uVar15;
  uint uVar16;
  int minh;
  int minw;
  uint8 tmpbuf [4096];
  
  uVar16 = raster->format;
  if ((uVar16 & 0x6000) != 0) {
    bVar7 = *(byte *)((long)&raster->pixels + (long)nativeRasterOffset + 4);
    transferMinSize(((uVar16 >> 0xe & 1) != 0) + 0x13,(int)(char)bVar7,&minw,&minh);
    uVar9 = minw;
    if (minw < raster->width) {
      uVar9 = raster->width;
    }
    puVar1 = raster->pixels;
    iVar12 = -1;
    for (iVar11 = 1; iVar11 < (int)uVar9; iVar11 = iVar11 * 2) {
      iVar12 = iVar12 + 1;
    }
    iVar11 = minh;
    if (minh < raster->height) {
      iVar11 = raster->height;
    }
    logw = iVar12 + 1;
    bVar5 = (byte)logw;
    uVar3 = (4 << (bVar5 & 0x1f)) - 1;
    if (((uVar16 >> 0xe & 1) == 0) || ((bVar7 & 4) == 0)) {
      if (((uVar16 >> 0xd & 1) != 0) && ((bVar7 & 2) != 0)) {
        uVar13 = 0;
        uVar8 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar8 = uVar13;
        }
        while (uVar16 = (uint)uVar13, (int)uVar16 < iVar11) {
          memcpy(tmpbuf,puVar1 + (int)(uVar16 << (bVar5 & 0x1f)),(long)(int)(uVar9 * 4));
          for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
            for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
              uVar14 = swizzle((uint32)uVar13,uVar10 | uVar16,logw);
              puVar1[(uint32)uVar13 + ((uVar10 | uVar16) << (bVar5 & 0x1f))] =
                   tmpbuf[uVar14 & uVar3];
            }
          }
          uVar13 = (ulong)(uVar16 + 4);
        }
      }
    }
    else {
      iVar2 = uVar9 * 2;
      uVar16 = 0;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      for (; (int)uVar16 < iVar11; uVar16 = uVar16 + 4) {
        memcpy(tmpbuf,puVar1 + (int)(uVar16 << ((byte)iVar12 & 0x1f)),(long)iVar2);
        for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
          for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
            uVar15 = ((uVar10 | uVar16) << (bVar5 & 0x1f)) + uVar14;
            uVar4 = swizzle(uVar14,uVar10 | uVar16,logw);
            bVar7 = tmpbuf[(uVar4 & uVar3) >> 1] >> 4;
            if ((uVar4 & 1) == 0) {
              bVar7 = tmpbuf[(uVar4 & uVar3) >> 1] & 0xf;
            }
            uVar6 = uVar15 >> 1;
            if ((uVar15 & 1) == 0) {
              bVar7 = puVar1[uVar6] & 0xf0 | bVar7;
            }
            else {
              bVar7 = bVar7 << 4 | puVar1[uVar6] & 0xf;
            }
            puVar1[uVar6] = bVar7;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
unswizzleRaster(Raster *raster)
{
	uint8 tmpbuf[1024*4];	// 1024x4px, maximum possible width
	uint32 mask;
	int32 x, y, w, h;
	int32 i;
	int32 logw;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint8 *px;

	if((raster->format & (Raster::PAL4|Raster::PAL8)) == 0)
		return;

	int minw, minh;
	transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	w = max(raster->width, minw);
	h = max(raster->height, minh);
	px = raster->pixels;
	logw = 0;
	for(i = 1; i < w; i *= 2) logw++;
	mask = (1<<(logw+2))-1;

	if(raster->format & Raster::PAL4 && natras->flags & Ps2Raster::SWIZZLED4){
		for(y = 0; y < h; y += 4){
			memcpy(tmpbuf, &px[y<<(logw-1)], 2*w);
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					uint8 c = s & 1 ? tmpbuf[s>>1] >> 4 : tmpbuf[s>>1] & 0xF;
					px[a>>1] = a & 1 ? (px[a>>1]&0xF) | c<<4 : (px[a>>1]&0xF0) | c;
				}
		}
	}else if(raster->format & Raster::PAL8 && natras->flags & Ps2Raster::SWIZZLED8){
		for(y = 0; y < h; y += 4){
			memcpy(tmpbuf, &px[y<<logw], 4*w);
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					px[a] = tmpbuf[s];
				}
		}
	}
}